

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TPublicType::initType(TPublicType *this,TSourceLoc *l)

{
  int iVar1;
  undefined4 uVar2;
  TSourceLoc *l_local;
  TPublicType *this_local;
  
  this->basicType = EbtVoid;
  *(ushort *)&this->field_0xb8 = *(ushort *)&this->field_0xb8 & 0xfff0 | 1;
  *(ushort *)&this->field_0xb8 = *(ushort *)&this->field_0xb8 & 0xf0ff;
  *(ushort *)&this->field_0xb8 = *(ushort *)&this->field_0xb8 & 0xff0f;
  this->arraySizes = (TArraySizes *)0x0;
  this->userDef = (TType *)0x0;
  (this->loc).name = l->name;
  iVar1 = l->line;
  (this->loc).string = l->string;
  (this->loc).line = iVar1;
  uVar2 = *(undefined4 *)&l->field_0x14;
  (this->loc).column = l->column;
  *(undefined4 *)&(this->loc).field_0x14 = uVar2;
  this->typeParameters = (TTypeParameters *)0x0;
  *(ushort *)&this->field_0xb8 = *(ushort *)&this->field_0xb8 & 0xefff;
  *(ushort *)&this->field_0xb8 = *(ushort *)&this->field_0xb8 & 0xdfff;
  *(ushort *)&this->field_0xb8 = *(ushort *)&this->field_0xb8 & 0xbfff;
  this->spirvType = (TSpirvType *)0x0;
  return;
}

Assistant:

void initType(const TSourceLoc& l)
    {
        basicType = EbtVoid;
        vectorSize = 1u;
        matrixRows = 0;
        matrixCols = 0;
        arraySizes = nullptr;
        userDef = nullptr;
        loc = l;
        typeParameters = nullptr;
        coopmatNV = false;
        coopmatKHR = false;
        coopvecNV = false;
        spirvType = nullptr;
    }